

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

string * __thiscall
directories::MADPGetProblemFilename_abi_cxx11_
          (string *__return_storage_ptr__,directories *this,Arguments *args)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  if (*(int *)(this + 0x6c) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,*(char **)(this + 8),(allocator<char> *)&local_28);
    MADPGetProblemFilename(__return_storage_ptr__,&local_48);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,*(char **)(this + 8),&local_49);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"toi-dpomdp",&local_4a);
    MADPGetProblemFilename(__return_storage_ptr__,&local_48,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string directories::MADPGetProblemFilename(const 
                                           ArgumentHandlers::Arguments &args)
{
    if(args.isTOI)
        return(MADPGetProblemFilename(args.dpf,"toi-dpomdp"));
    else
        return(MADPGetProblemFilename(args.dpf));
}